

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O3

void __thiscall spvtools::opt::LoopFissionPass::LoopFissionPass(LoopFissionPass *this)

{
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__LoopFissionPass_009392e0;
  (this->split_criteria_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->split_criteria_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->split_criteria_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->split_criteria_).super__Function_base._M_functor + 8) = 0;
  this->split_multiple_times_ = false;
  (this->split_criteria_).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_spvtools::opt::RegisterLiveness::RegionRegisterLiveness_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fission.cpp:434:21)>
       ::_M_manager;
  (this->split_criteria_)._M_invoker =
       std::
       _Function_handler<bool_(const_spvtools::opt::RegisterLiveness::RegionRegisterLiveness_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fission.cpp:434:21)>
       ::_M_invoke;
  return;
}

Assistant:

LoopFissionPass::LoopFissionPass() : split_multiple_times_(false) {
  // Split by default.
  split_criteria_ = [](const RegisterLiveness::RegionRegisterLiveness&) {
    return true;
  };
}